

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O2

void slab_put_large(slab_cache *cache,slab *slab)

{
  size_t *psVar1;
  small_stats *psVar2;
  size_t size;
  rlist *prVar3;
  rlist *prVar4;
  unsigned_long _zzq_args [6];
  unsigned_long _zzq_result;
  
  slab_assert(cache,slab);
  if (cache->order_max + 1 == (uint)slab->order) {
    size = slab->size;
    prVar3 = (slab->next_in_cache).prev;
    prVar4 = (slab->next_in_cache).next;
    prVar3->next = prVar4;
    prVar4->prev = prVar3;
    (slab->next_in_cache).next = &slab->next_in_cache;
    (slab->next_in_cache).prev = &slab->next_in_cache;
    psVar1 = &(cache->allocated).stats.total;
    *psVar1 = *psVar1 - size;
    psVar2 = &(cache->allocated).stats;
    psVar2->used = psVar2->used - size;
    quota_release(cache->arena->quota,size);
    slab_poison(slab);
    free(slab);
    return;
  }
  __assert_fail("slab->order == cache->order_max + 1",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                ,0x126,"void slab_put_large(struct slab_cache *, struct slab *)");
}

Assistant:

void
slab_put_large(struct slab_cache *cache, struct slab *slab)
{
	slab_assert(cache, slab);
	assert(slab->order == cache->order_max + 1);
	/*
	 * Free a huge slab right away, we have no
	 * further business to do with it.
	 */
	size_t slab_size = slab->size;
	slab_list_del(&cache->allocated, slab, next_in_cache);
	cache->allocated.stats.used -= slab_size;
	quota_release(cache->arena->quota, slab_size);
	slab_poison(slab);
	VALGRIND_MEMPOOL_FREE(cache, slab_data(slab));
	free(slab);
	return;
}